

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O2

void __thiscall ByteData_EqualsMatch_Test::TestBody(ByteData_EqualsMatch_Test *this)

{
  char *in_R9;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70;
  ByteData byte_data2;
  AssertionResult gtest_ar_;
  ByteData byte_data1;
  
  std::__cxx11::string::string
            ((string *)&local_70,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)&byte_data2);
  cfd::core::ByteData::ByteData(&byte_data1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_70,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)&gtest_ar_);
  cfd::core::ByteData::ByteData(&byte_data2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  gtest_ar_.success_ = cfd::core::ByteData::Equals(&byte_data1,&byte_data2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,(AssertionResult *)"is_equals","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x91,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data1);
  return;
}

Assistant:

TEST(ByteData, EqualsMatch) {
  ByteData byte_data1 = ByteData(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData byte_data2 = ByteData(
      "1234567890123456789012345678901234567890123456789012345678901234");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_TRUE(is_equals);
}